

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O1

Config * Config::load(Config *__return_storage_ptr__,string *file)

{
  _Base_ptr v;
  _Rb_tree_node_base *p_Var1;
  pointer pcVar2;
  SamplePublisher *pSVar3;
  _Head_base<0UL,_SamplePublisher_*,_false> _Var4;
  _Head_base<0UL,_SoftBitPublisher_*,_false> _Var5;
  _Head_base<0UL,_PacketPublisher_*,_false> _Var6;
  double dVar7;
  _Alloc_hider _Var8;
  undefined8 uVar9;
  bool bVar10;
  int iVar11;
  uint32_t uVar12;
  Table *pTVar13;
  _Rb_tree_header *p_Var14;
  _Rb_tree_node_base *p_Var15;
  Value *pVVar16;
  _Base_ptr p_Var17;
  invalid_argument *piVar18;
  pointer *__ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  _Rb_tree_node_base *key_00;
  Config *pCVar19;
  stringstream ss;
  ParseResult pr;
  string local_238;
  _Rb_tree_node_base *local_218;
  Monitor *local_210;
  string *local_208;
  _Base_ptr local_200;
  Config *local_1f8;
  _Base_ptr local_1f0;
  undefined1 local_1e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8 [23];
  undefined1 local_60 [16];
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  (__return_storage_ptr__->demodulator).downlinkType._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->demodulator).downlinkType.field_2;
  (__return_storage_ptr__->demodulator).downlinkType._M_string_length = 0;
  (__return_storage_ptr__->demodulator).downlinkType.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->demodulator).source._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->demodulator).source.field_2;
  (__return_storage_ptr__->demodulator).source._M_string_length = 0;
  (__return_storage_ptr__->demodulator).source.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->demodulator).statsPublisher.bind.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->demodulator).statsPublisher.bind.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->demodulator).statsPublisher.bind.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->demodulator).statsPublisher.sendBuffer = 0;
  (__return_storage_ptr__->demodulator).decimation = 1;
  (__return_storage_ptr__->airspy).frequency = 0;
  (__return_storage_ptr__->airspy).sampleRate = 0;
  (__return_storage_ptr__->airspy).gain = '\x12';
  (__return_storage_ptr__->airspy).bias_tee = false;
  (__return_storage_ptr__->airspy).samplePublisher._M_t.
  super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>._M_t.
  super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
  super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl = (SamplePublisher *)0x0;
  (__return_storage_ptr__->rtlsdr).frequency = 0;
  (__return_storage_ptr__->rtlsdr).sampleRate = 0;
  (__return_storage_ptr__->rtlsdr).gain = '\x1e';
  (__return_storage_ptr__->rtlsdr).bias_tee = false;
  *(undefined8 *)&(__return_storage_ptr__->rtlsdr).deviceIndex = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->rtlsdr).samplePublisher._M_t.
           super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>._M_t.
           super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
           super__Head_base<0UL,_SamplePublisher_*,_false> + 4) = 0;
  (__return_storage_ptr__->nanomsg).connect._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->nanomsg).connect.field_2;
  (__return_storage_ptr__->nanomsg).connect._M_string_length = 0;
  (__return_storage_ptr__->nanomsg).connect.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->nanomsg).receiveBuffer = 0;
  (__return_storage_ptr__->nanomsg).samplePublisher._M_t.
  super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>._M_t.
  super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
  super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl = (SamplePublisher *)0x0;
  (__return_storage_ptr__->agc).min = 1e-06;
  (__return_storage_ptr__->agc).max = 1e+06;
  (__return_storage_ptr__->agc).samplePublisher._M_t.
  super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>._M_t.
  super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
  super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl = (SamplePublisher *)0x0;
  (__return_storage_ptr__->costas).maxDeviation = 20000;
  (__return_storage_ptr__->decoder).statsPublisher.sendBuffer = 0;
  (__return_storage_ptr__->decoder).statsPublisher.bind.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->decoder).statsPublisher.bind.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->decoder).packetPublisher._M_t.
  super___uniq_ptr_impl<PacketPublisher,_std::default_delete<PacketPublisher>_>._M_t.
  super__Tuple_impl<0UL,_PacketPublisher_*,_std::default_delete<PacketPublisher>_>.
  super__Head_base<0UL,_PacketPublisher_*,_false>._M_head_impl = (PacketPublisher *)0x0;
  (__return_storage_ptr__->decoder).statsPublisher.bind.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->clockRecovery).samplePublisher._M_t.
  super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>._M_t.
  super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
  super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl = (SamplePublisher *)0x0;
  (__return_storage_ptr__->quantization).softBitPublisher._M_t.
  super___uniq_ptr_impl<SoftBitPublisher,_std::default_delete<SoftBitPublisher>_>._M_t.
  super__Tuple_impl<0UL,_SoftBitPublisher_*,_std::default_delete<SoftBitPublisher>_>.
  super__Head_base<0UL,_SoftBitPublisher_*,_false>._M_head_impl = (SoftBitPublisher *)0x0;
  (__return_storage_ptr__->costas).samplePublisher._M_t.
  super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>._M_t.
  super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
  super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl = (SamplePublisher *)0x0;
  (__return_storage_ptr__->rrc).samplePublisher._M_t.
  super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>._M_t.
  super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
  super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl = (SamplePublisher *)0x0;
  (__return_storage_ptr__->monitor).statsdAddress._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->monitor).statsdAddress.field_2;
  (__return_storage_ptr__->monitor).statsdAddress._M_string_length = 0;
  (__return_storage_ptr__->monitor).statsdAddress.field_2._M_local_buf[0] = '\0';
  toml::parseFile((ParseResult *)local_60,file);
  if (local_60._0_4_ == NULL_TYPE) {
    piVar18 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar18,(string *)&local_50);
    __cxa_throw(piVar18,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pTVar13 = toml::Value::
            ValueConverter<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>_>
            ::to((ValueConverter<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>_>
                  *)local_1e8,(Value *)local_60);
  p_Var17 = (pTVar13->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var14 = &(pTVar13->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var17 != p_Var14) {
    local_1f8 = (Config *)&(__return_storage_ptr__->demodulator).source;
    local_210 = &__return_storage_ptr__->monitor;
    local_208 = (string *)&(__return_storage_ptr__->nanomsg).connect;
    local_200 = &p_Var14->_M_header;
    do {
      key_00 = p_Var17 + 1;
      v = p_Var17 + 2;
      local_1f0 = p_Var17;
      iVar11 = std::__cxx11::string::compare((char *)key_00);
      if (iVar11 == 0) {
        pTVar13 = toml::Value::
                  ValueConverter<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>_>
                  ::to((ValueConverter<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>_>
                        *)local_1e8,(Value *)v);
        for (p_Var15 = (pTVar13->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var15 != &(pTVar13->_M_t)._M_impl.super__Rb_tree_header;
            p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
          key_00 = p_Var15 + 1;
          p_Var1 = p_Var15 + 2;
          iVar11 = std::__cxx11::string::compare((char *)key_00);
          if (iVar11 == 0) {
            toml::Value::
            ValueConverter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::to((ValueConverter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_1e8,(Value *)p_Var1);
            pCVar19 = __return_storage_ptr__;
LAB_00132536:
            std::__cxx11::string::_M_assign((string *)pCVar19);
          }
          else {
            iVar11 = std::__cxx11::string::compare((char *)key_00);
            if (iVar11 == 0) {
              toml::Value::
              ValueConverter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::to((ValueConverter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1e8,(Value *)p_Var1);
              pCVar19 = local_1f8;
              goto LAB_00132536;
            }
            iVar11 = std::__cxx11::string::compare((char *)key_00);
            if (iVar11 == 0) {
              anon_unknown.dwarf_1996e::createStatsPublisher
                        ((StatsPublisher *)local_1e8,(Value *)p_Var1);
              local_238._M_dataplus._M_p =
                   (pointer)(__return_storage_ptr__->demodulator).statsPublisher.bind.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
              local_238._M_string_length =
                   (size_type)
                   (__return_storage_ptr__->demodulator).statsPublisher.bind.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_238.field_2._M_allocated_capacity =
                   (size_type)
                   (__return_storage_ptr__->demodulator).statsPublisher.bind.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              (__return_storage_ptr__->demodulator).statsPublisher.bind.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1e8._0_8_;
              (__return_storage_ptr__->demodulator).statsPublisher.bind.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1e8._8_8_;
              (__return_storage_ptr__->demodulator).statsPublisher.bind.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)CONCAT17(local_1d8[0]._M_local_buf[7],
                                     CONCAT25(local_1d8[0]._M_allocated_capacity._5_2_,
                                              CONCAT14(local_1d8[0]._M_local_buf[4],
                                                       (undefined4)
                                                       local_1d8[0]._M_allocated_capacity)));
              local_1e8._0_8_ = (SamplePublisher *)0x0;
              local_1e8._8_8_ = (pointer)0x0;
              local_1d8[0]._M_allocated_capacity._0_4_ = 0;
              local_1d8[0]._M_local_buf[4] = '\0';
              local_1d8[0]._M_allocated_capacity._5_2_ = 0;
              local_1d8[0]._7_4_ = local_1d8[0]._7_4_ & 0xffffff00;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_238);
              (__return_storage_ptr__->demodulator).statsPublisher.sendBuffer =
                   CONCAT44(local_1d8[0]._12_4_,
                            CONCAT13(local_1d8[0]._M_local_buf[0xb],local_1d8[0]._8_3_));
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1e8);
            }
            else {
              iVar11 = std::__cxx11::string::compare((char *)key_00);
              if (iVar11 != 0) goto LAB_001330f8;
              iVar11 = toml::Value::ValueConverter<int>::to
                                 ((ValueConverter<int> *)local_1e8,(Value *)p_Var1);
              (__return_storage_ptr__->demodulator).decimation = iVar11;
            }
          }
        }
      }
      else {
        iVar11 = std::__cxx11::string::compare((char *)key_00);
        if (iVar11 == 0) {
          pTVar13 = toml::Value::
                    ValueConverter<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>_>
                    ::to((ValueConverter<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>_>
                          *)local_1e8,(Value *)v);
          for (p_Var15 = (pTVar13->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var15 != &(pTVar13->_M_t)._M_impl.super__Rb_tree_header;
              p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
            key_00 = p_Var15 + 1;
            p_Var1 = p_Var15 + 2;
            iVar11 = std::__cxx11::string::compare((char *)key_00);
            if (iVar11 == 0) {
              uVar12 = toml::Value::ValueConverter<int>::to
                                 ((ValueConverter<int> *)local_1e8,(Value *)p_Var1);
              (__return_storage_ptr__->airspy).frequency = uVar12;
            }
            else {
              iVar11 = std::__cxx11::string::compare((char *)key_00);
              if (iVar11 == 0) {
                uVar12 = toml::Value::ValueConverter<int>::to
                                   ((ValueConverter<int> *)local_1e8,(Value *)p_Var1);
                (__return_storage_ptr__->airspy).sampleRate = uVar12;
              }
              else {
                iVar11 = std::__cxx11::string::compare((char *)key_00);
                if (iVar11 == 0) {
                  iVar11 = toml::Value::ValueConverter<int>::to
                                     ((ValueConverter<int> *)local_1e8,(Value *)p_Var1);
                  (__return_storage_ptr__->airspy).gain = (uint8_t)iVar11;
                }
                else {
                  iVar11 = std::__cxx11::string::compare((char *)key_00);
                  if (iVar11 == 0) {
                    anon_unknown.dwarf_1996e::createSamplePublisher
                              ((anon_unknown_dwarf_1996e *)local_1e8,(Value *)p_Var1);
                    uVar9 = local_1e8._0_8_;
                    local_1e8._0_8_ = (SamplePublisher *)0x0;
                    pSVar3 = (__return_storage_ptr__->airspy).samplePublisher._M_t.
                             super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>
                             .super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl;
                    (__return_storage_ptr__->airspy).samplePublisher._M_t.
                    super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>
                    .super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl =
                         (SamplePublisher *)uVar9;
                    if (pSVar3 != (SamplePublisher *)0x0) {
                      (**(code **)((long)(pSVar3->super_Publisher)._vptr_Publisher + 8))();
                    }
                    if ((SamplePublisher *)local_1e8._0_8_ != (SamplePublisher *)0x0) {
                      (**(code **)(*(long *)local_1e8._0_8_ + 8))();
                    }
                  }
                  else {
                    iVar11 = std::__cxx11::string::compare((char *)key_00);
                    if (iVar11 != 0) goto LAB_001330f8;
                    bVar10 = toml::Value::ValueConverter<bool>::to
                                       ((ValueConverter<bool> *)local_1e8,(Value *)p_Var1);
                    (__return_storage_ptr__->airspy).bias_tee = bVar10;
                  }
                }
              }
            }
          }
        }
        else {
          iVar11 = std::__cxx11::string::compare((char *)key_00);
          if (iVar11 == 0) {
            pTVar13 = toml::Value::
                      ValueConverter<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>_>
                      ::to((ValueConverter<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>_>
                            *)local_1e8,(Value *)v);
            for (p_Var15 = (pTVar13->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var15 != &(pTVar13->_M_t)._M_impl.super__Rb_tree_header;
                p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
              key_00 = p_Var15 + 1;
              p_Var1 = p_Var15 + 2;
              iVar11 = std::__cxx11::string::compare((char *)key_00);
              if (iVar11 == 0) {
                uVar12 = toml::Value::ValueConverter<int>::to
                                   ((ValueConverter<int> *)local_1e8,(Value *)p_Var1);
                (__return_storage_ptr__->rtlsdr).frequency = uVar12;
              }
              else {
                iVar11 = std::__cxx11::string::compare((char *)key_00);
                if (iVar11 == 0) {
                  uVar12 = toml::Value::ValueConverter<int>::to
                                     ((ValueConverter<int> *)local_1e8,(Value *)p_Var1);
                  (__return_storage_ptr__->rtlsdr).sampleRate = uVar12;
                }
                else {
                  iVar11 = std::__cxx11::string::compare((char *)key_00);
                  if (iVar11 == 0) {
                    iVar11 = toml::Value::ValueConverter<int>::to
                                       ((ValueConverter<int> *)local_1e8,(Value *)p_Var1);
                    (__return_storage_ptr__->rtlsdr).gain = (uint8_t)iVar11;
                  }
                  else {
                    iVar11 = std::__cxx11::string::compare((char *)key_00);
                    if (iVar11 == 0) {
                      anon_unknown.dwarf_1996e::createSamplePublisher
                                ((anon_unknown_dwarf_1996e *)local_1e8,(Value *)p_Var1);
                      uVar9 = local_1e8._0_8_;
                      local_1e8._0_8_ = (SamplePublisher *)0x0;
                      pSVar3 = (__return_storage_ptr__->rtlsdr).samplePublisher._M_t.
                               super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>
                               .super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl;
                      (__return_storage_ptr__->rtlsdr).samplePublisher._M_t.
                      super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>
                      .super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl =
                           (SamplePublisher *)uVar9;
                      if (pSVar3 != (SamplePublisher *)0x0) {
                        (**(code **)((long)(pSVar3->super_Publisher)._vptr_Publisher + 8))();
                      }
                      if ((SamplePublisher *)local_1e8._0_8_ != (SamplePublisher *)0x0) {
                        (**(code **)(*(long *)local_1e8._0_8_ + 8))();
                      }
                    }
                    else {
                      iVar11 = std::__cxx11::string::compare((char *)key_00);
                      if (iVar11 == 0) {
                        bVar10 = toml::Value::ValueConverter<bool>::to
                                           ((ValueConverter<bool> *)local_1e8,(Value *)p_Var1);
                        (__return_storage_ptr__->rtlsdr).bias_tee = bVar10;
                      }
                      else {
                        iVar11 = std::__cxx11::string::compare((char *)key_00);
                        if (iVar11 != 0) goto LAB_001330f8;
                        uVar12 = toml::Value::ValueConverter<int>::to
                                           ((ValueConverter<int> *)local_1e8,(Value *)p_Var1);
                        (__return_storage_ptr__->rtlsdr).deviceIndex = uVar12;
                      }
                    }
                  }
                }
              }
            }
          }
          else {
            iVar11 = std::__cxx11::string::compare((char *)key_00);
            if (iVar11 == 0) {
              pTVar13 = toml::Value::
                        ValueConverter<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>_>
                        ::to((ValueConverter<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>_>
                              *)local_1e8,(Value *)v);
              for (p_Var15 = (pTVar13->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                  (_Rb_tree_header *)p_Var15 != &(pTVar13->_M_t)._M_impl.super__Rb_tree_header;
                  p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
                key_00 = p_Var15 + 1;
                p_Var1 = p_Var15 + 2;
                iVar11 = std::__cxx11::string::compare((char *)key_00);
                if (iVar11 == 0) {
                  uVar12 = toml::Value::ValueConverter<int>::to
                                     ((ValueConverter<int> *)local_1e8,(Value *)p_Var1);
                  (__return_storage_ptr__->nanomsg).sampleRate = uVar12;
                }
                else {
                  iVar11 = std::__cxx11::string::compare((char *)key_00);
                  if (iVar11 == 0) {
                    toml::Value::
                    ValueConverter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::to((ValueConverter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_1e8,(Value *)p_Var1);
                    std::__cxx11::string::_M_assign(local_208);
                  }
                  else {
                    iVar11 = std::__cxx11::string::compare((char *)key_00);
                    if (iVar11 == 0) {
                      iVar11 = toml::Value::ValueConverter<int>::to
                                         ((ValueConverter<int> *)local_1e8,(Value *)p_Var1);
                      (__return_storage_ptr__->nanomsg).receiveBuffer = (long)iVar11;
                    }
                    else {
                      iVar11 = std::__cxx11::string::compare((char *)key_00);
                      if (iVar11 != 0) goto LAB_001330f8;
                      anon_unknown.dwarf_1996e::createSamplePublisher
                                ((anon_unknown_dwarf_1996e *)local_1e8,(Value *)p_Var1);
                      uVar9 = local_1e8._0_8_;
                      local_1e8._0_8_ = (SamplePublisher *)0x0;
                      pSVar3 = (__return_storage_ptr__->nanomsg).samplePublisher._M_t.
                               super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>
                               .super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl;
                      (__return_storage_ptr__->nanomsg).samplePublisher._M_t.
                      super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>
                      .super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl =
                           (SamplePublisher *)uVar9;
                      if (pSVar3 != (SamplePublisher *)0x0) {
                        (**(code **)((long)(pSVar3->super_Publisher)._vptr_Publisher + 8))();
                      }
                      if ((SamplePublisher *)local_1e8._0_8_ != (SamplePublisher *)0x0) {
                        (**(code **)(*(long *)local_1e8._0_8_ + 8))();
                      }
                    }
                  }
                }
              }
              if ((__return_storage_ptr__->nanomsg).sampleRate == 0) {
                std::__cxx11::stringstream::stringstream((stringstream *)local_1e8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_1e8 + 0x10),"Key not set: sample_rate",0x18);
                piVar18 = (invalid_argument *)__cxa_allocate_exception(0x10);
                std::__cxx11::stringbuf::str();
                std::invalid_argument::invalid_argument(piVar18,(string *)&local_238);
                __cxa_throw(piVar18,&std::invalid_argument::typeinfo,
                            std::invalid_argument::~invalid_argument);
              }
            }
            else {
              iVar11 = std::__cxx11::string::compare((char *)key_00);
              if (iVar11 == 0) {
                pTVar13 = toml::Value::
                          ValueConverter<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>_>
                          ::to((ValueConverter<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>_>
                                *)local_1e8,(Value *)v);
                for (p_Var15 = (pTVar13->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                    (_Rb_tree_header *)p_Var15 != &(pTVar13->_M_t)._M_impl.super__Rb_tree_header;
                    p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
                  key_00 = p_Var15 + 1;
                  p_Var1 = p_Var15 + 2;
                  iVar11 = std::__cxx11::string::compare((char *)key_00);
                  if (iVar11 == 0) {
                    dVar7 = toml::Value::ValueConverter<double>::to
                                      ((ValueConverter<double> *)local_1e8,(Value *)p_Var1);
                    (__return_storage_ptr__->agc).min = (float)dVar7;
                  }
                  else {
                    iVar11 = std::__cxx11::string::compare((char *)key_00);
                    if (iVar11 == 0) {
                      dVar7 = toml::Value::ValueConverter<double>::to
                                        ((ValueConverter<double> *)local_1e8,(Value *)p_Var1);
                      (__return_storage_ptr__->agc).max = (float)dVar7;
                    }
                    else {
                      iVar11 = std::__cxx11::string::compare((char *)key_00);
                      if (iVar11 != 0) goto LAB_001330f8;
                      anon_unknown.dwarf_1996e::createSamplePublisher
                                ((anon_unknown_dwarf_1996e *)local_1e8,(Value *)p_Var1);
                      uVar9 = local_1e8._0_8_;
                      local_1e8._0_8_ = (SamplePublisher *)0x0;
                      pSVar3 = (__return_storage_ptr__->agc).samplePublisher._M_t.
                               super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>
                               .super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl;
                      (__return_storage_ptr__->agc).samplePublisher._M_t.
                      super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>
                      .super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl =
                           (SamplePublisher *)uVar9;
                      if (pSVar3 != (SamplePublisher *)0x0) {
                        (**(code **)((long)(pSVar3->super_Publisher)._vptr_Publisher + 8))();
                      }
                      if ((SamplePublisher *)local_1e8._0_8_ != (SamplePublisher *)0x0) {
                        (**(code **)(*(long *)local_1e8._0_8_ + 8))();
                      }
                    }
                  }
                }
              }
              else {
                iVar11 = std::__cxx11::string::compare((char *)key_00);
                if (iVar11 == 0) {
                  pTVar13 = toml::Value::
                            ValueConverter<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>_>
                            ::to((ValueConverter<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>_>
                                  *)local_1e8,(Value *)v);
                  for (p_Var15 = (pTVar13->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                      (_Rb_tree_header *)p_Var15 != &(pTVar13->_M_t)._M_impl.super__Rb_tree_header;
                      p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
                    key_00 = p_Var15 + 1;
                    iVar11 = std::__cxx11::string::compare((char *)key_00);
                    if (iVar11 == 0) {
                      dVar7 = toml::Value::ValueConverter<double>::to
                                        ((ValueConverter<double> *)local_1e8,(Value *)(p_Var15 + 2))
                      ;
                      (__return_storage_ptr__->costas).maxDeviation = (int)dVar7;
                      if ((int)dVar7 < 1) goto LAB_00133100;
                    }
                    else {
                      iVar11 = std::__cxx11::string::compare((char *)key_00);
                      if (iVar11 != 0) goto LAB_001330f8;
                      anon_unknown.dwarf_1996e::createSamplePublisher
                                ((anon_unknown_dwarf_1996e *)local_1e8,(Value *)(p_Var15 + 2));
                      uVar9 = local_1e8._0_8_;
                      local_1e8._0_8_ = (SamplePublisher *)0x0;
                      pSVar3 = (__return_storage_ptr__->costas).samplePublisher._M_t.
                               super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>
                               .super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl;
                      (__return_storage_ptr__->costas).samplePublisher._M_t.
                      super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>
                      .super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl =
                           (SamplePublisher *)uVar9;
                      if (pSVar3 != (SamplePublisher *)0x0) {
                        (**(code **)((long)(pSVar3->super_Publisher)._vptr_Publisher + 8))();
                      }
                      if ((SamplePublisher *)local_1e8._0_8_ != (SamplePublisher *)0x0) {
                        (**(code **)(*(long *)local_1e8._0_8_ + 8))();
                      }
                    }
                  }
                }
                else {
                  iVar11 = std::__cxx11::string::compare((char *)key_00);
                  if (iVar11 == 0) {
                    pTVar13 = toml::Value::
                              ValueConverter<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>_>
                              ::to((ValueConverter<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>_>
                                    *)local_1e8,(Value *)v);
                    for (p_Var15 = (pTVar13->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                        (_Rb_tree_header *)p_Var15 != &(pTVar13->_M_t)._M_impl.super__Rb_tree_header
                        ; p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
                      key_00 = p_Var15 + 1;
                      iVar11 = std::__cxx11::string::compare((char *)key_00);
                      if (iVar11 != 0) goto LAB_001330f8;
                      anon_unknown.dwarf_1996e::createSamplePublisher
                                ((anon_unknown_dwarf_1996e *)local_1e8,(Value *)(p_Var15 + 2));
                      uVar9 = local_1e8._0_8_;
                      local_1e8._0_8_ = (SamplePublisher *)0x0;
                      _Var4._M_head_impl =
                           (__return_storage_ptr__->rrc).samplePublisher._M_t.
                           super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>
                           .super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl;
                      (__return_storage_ptr__->rrc).samplePublisher._M_t.
                      super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>
                      .super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl =
                           (SamplePublisher *)uVar9;
                      if (_Var4._M_head_impl != (SamplePublisher *)0x0) {
                        (**(code **)(*(long *)&(_Var4._M_head_impl)->super_Publisher + 8))();
                      }
                      if ((SamplePublisher *)local_1e8._0_8_ != (SamplePublisher *)0x0) {
                        (**(code **)(*(long *)local_1e8._0_8_ + 8))();
                      }
                    }
                  }
                  else {
                    iVar11 = std::__cxx11::string::compare((char *)key_00);
                    if (iVar11 == 0) {
                      pTVar13 = toml::Value::
                                ValueConverter<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>_>
                                ::to((ValueConverter<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>_>
                                      *)local_1e8,(Value *)v);
                      for (p_Var15 = (pTVar13->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left
                          ; (_Rb_tree_header *)p_Var15 !=
                            &(pTVar13->_M_t)._M_impl.super__Rb_tree_header;
                          p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
                        key_00 = p_Var15 + 1;
                        iVar11 = std::__cxx11::string::compare((char *)key_00);
                        if (iVar11 != 0) goto LAB_001330f8;
                        anon_unknown.dwarf_1996e::createSamplePublisher
                                  ((anon_unknown_dwarf_1996e *)local_1e8,(Value *)(p_Var15 + 2));
                        uVar9 = local_1e8._0_8_;
                        local_1e8._0_8_ = (SamplePublisher *)0x0;
                        _Var4._M_head_impl =
                             (__return_storage_ptr__->clockRecovery).samplePublisher._M_t.
                             super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>
                             .super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl;
                        (__return_storage_ptr__->clockRecovery).samplePublisher._M_t.
                        super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>
                        .super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl =
                             (SamplePublisher *)uVar9;
                        if (_Var4._M_head_impl != (SamplePublisher *)0x0) {
                          (**(code **)(*(long *)&(_Var4._M_head_impl)->super_Publisher + 8))();
                        }
                        if ((SamplePublisher *)local_1e8._0_8_ != (SamplePublisher *)0x0) {
                          (**(code **)(*(long *)local_1e8._0_8_ + 8))();
                        }
                      }
                    }
                    else {
                      iVar11 = std::__cxx11::string::compare((char *)key_00);
                      if (iVar11 == 0) {
                        pTVar13 = toml::Value::
                                  ValueConverter<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>_>
                                  ::to((ValueConverter<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>_>
                                        *)local_1e8,(Value *)v);
                        p_Var17 = (pTVar13->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                        local_218 = &(pTVar13->_M_t)._M_impl.super__Rb_tree_header._M_header;
                        if (p_Var17 != local_218) {
                          do {
                            key_00 = p_Var17 + 1;
                            iVar11 = std::__cxx11::string::compare((char *)key_00);
                            if (iVar11 != 0) goto LAB_001330f8;
                            local_1d8[0]._M_allocated_capacity._0_4_ = 0x646e6962;
                            local_1e8._8_8_ = (pointer)0x4;
                            local_1d8[0]._M_local_buf[4] = '\0';
                            local_1e8._0_8_ = (SamplePublisher *)(local_1e8 + 0x10);
                            pVVar16 = toml::Value::find((Value *)(p_Var17 + 2),(string *)local_1e8);
                            if ((SamplePublisher *)local_1e8._0_8_ !=
                                (SamplePublisher *)(local_1e8 + 0x10)) {
                              operator_delete((void *)local_1e8._0_8_,
                                              CONCAT17(local_1d8[0]._M_local_buf[7],
                                                       CONCAT25(local_1d8[0]._M_allocated_capacity.
                                                                _5_2_,CONCAT14(local_1d8[0].
                                                                               _M_local_buf[4],
                                                                               (undefined4)
                                                                               local_1d8[0].
                                                                               _M_allocated_capacity
                                                                              ))) + 1);
                            }
                            if (pVVar16 == (Value *)0x0) {
                              piVar18 = (invalid_argument *)__cxa_allocate_exception(0x10);
                              std::invalid_argument::invalid_argument
                                        (piVar18,"Expected publisher section to have \"bind\" key");
                              goto LAB_0013313a;
                            }
                            toml::Value::
                            ValueConverter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::to((ValueConverter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_1e8,pVVar16);
                            SoftBitPublisher::create(&local_238);
                            local_1d8[0]._M_allocated_capacity._0_4_ = 0x646e6573;
                            local_1d8[0]._M_local_buf[4] = '_';
                            local_1d8[0]._M_allocated_capacity._5_2_ = 0x7562;
                            local_1d8[0]._7_4_ = 0x72656666;
                            local_1e8._8_8_ = (pointer)0xb;
                            local_1d8[0]._M_local_buf[0xb] = '\0';
                            local_1e8._0_8_ = (SamplePublisher *)(local_1e8 + 0x10);
                            pVVar16 = toml::Value::find((Value *)(p_Var17 + 2),(string *)local_1e8);
                            if ((SamplePublisher *)local_1e8._0_8_ !=
                                (SamplePublisher *)(local_1e8 + 0x10)) {
                              operator_delete((void *)local_1e8._0_8_,
                                              CONCAT17(local_1d8[0]._M_local_buf[7],
                                                       CONCAT25(local_1d8[0]._M_allocated_capacity.
                                                                _5_2_,CONCAT14(local_1d8[0].
                                                                               _M_local_buf[4],
                                                                               (undefined4)
                                                                               local_1d8[0].
                                                                               _M_allocated_capacity
                                                                              ))) + 1);
                            }
                            _Var8._M_p = local_238._M_dataplus._M_p;
                            if (pVVar16 != (Value *)0x0) {
                              iVar11 = toml::Value::ValueConverter<int>::to
                                                 ((ValueConverter<int> *)local_1e8,pVVar16);
                              Publisher::setSendBuffer((Publisher *)_Var8._M_p,iVar11);
                            }
                            _Var8._M_p = local_238._M_dataplus._M_p;
                            local_238._M_dataplus._M_p = (pointer)0x0;
                            _Var5._M_head_impl =
                                 (__return_storage_ptr__->quantization).softBitPublisher._M_t.
                                 super___uniq_ptr_impl<SoftBitPublisher,_std::default_delete<SoftBitPublisher>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_SoftBitPublisher_*,_std::default_delete<SoftBitPublisher>_>
                                 .super__Head_base<0UL,_SoftBitPublisher_*,_false>._M_head_impl;
                            (__return_storage_ptr__->quantization).softBitPublisher._M_t.
                            super___uniq_ptr_impl<SoftBitPublisher,_std::default_delete<SoftBitPublisher>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_SoftBitPublisher_*,_std::default_delete<SoftBitPublisher>_>
                            .super__Head_base<0UL,_SoftBitPublisher_*,_false>._M_head_impl =
                                 (SoftBitPublisher *)_Var8._M_p;
                            if (_Var5._M_head_impl != (SoftBitPublisher *)0x0) {
                              (**(code **)(*(long *)&(_Var5._M_head_impl)->super_Publisher + 8))();
                            }
                            if ((pointer)local_238._M_dataplus._M_p != (pointer)0x0) {
                              (**(code **)(*(long *)local_238._M_dataplus._M_p + 8))();
                            }
                            p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17);
                          } while (p_Var17 != local_218);
                        }
                      }
                      else {
                        iVar11 = std::__cxx11::string::compare((char *)key_00);
                        if (iVar11 == 0) {
                          pTVar13 = toml::Value::
                                    ValueConverter<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>_>
                                    ::to((ValueConverter<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>_>
                                          *)local_1e8,(Value *)v);
                          p_Var17 = (pTVar13->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                          local_218 = &(pTVar13->_M_t)._M_impl.super__Rb_tree_header._M_header;
                          if (p_Var17 != local_218) {
                            do {
                              key_00 = p_Var17 + 1;
                              p_Var15 = p_Var17 + 2;
                              iVar11 = std::__cxx11::string::compare((char *)key_00);
                              if (iVar11 == 0) {
                                local_1d8[0]._M_allocated_capacity._0_4_ = 0x646e6962;
                                local_1e8._8_8_ = (pointer)0x4;
                                local_1d8[0]._M_local_buf[4] = '\0';
                                local_1e8._0_8_ = (SamplePublisher *)(local_1e8 + 0x10);
                                pVVar16 = toml::Value::find((Value *)p_Var15,(string *)local_1e8);
                                if ((SamplePublisher *)local_1e8._0_8_ !=
                                    (SamplePublisher *)(local_1e8 + 0x10)) {
                                  operator_delete((void *)local_1e8._0_8_,
                                                  CONCAT17(local_1d8[0]._M_local_buf[7],
                                                           CONCAT25(local_1d8[0].
                                                                    _M_allocated_capacity._5_2_,
                                                                    CONCAT14(local_1d8[0].
                                                                             _M_local_buf[4],
                                                                             (undefined4)
                                                                             local_1d8[0].
                                                                             _M_allocated_capacity))
                                                          ) + 1);
                                }
                                if (pVVar16 == (Value *)0x0) {
                                  piVar18 = (invalid_argument *)__cxa_allocate_exception(0x10);
                                  std::invalid_argument::invalid_argument
                                            (piVar18,
                                             "Expected publisher section to have \"bind\" key");
                                  goto LAB_0013313a;
                                }
                                toml::Value::
                                ValueConverter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::to((ValueConverter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)local_1e8,pVVar16);
                                PacketPublisher::create(&local_238);
                                local_1d8[0]._M_allocated_capacity._0_4_ = 0x646e6573;
                                local_1d8[0]._M_local_buf[4] = '_';
                                local_1d8[0]._M_allocated_capacity._5_2_ = 0x7562;
                                local_1d8[0]._7_4_ = 0x72656666;
                                local_1e8._8_8_ = (pointer)0xb;
                                local_1d8[0]._M_local_buf[0xb] = '\0';
                                local_1e8._0_8_ = (SamplePublisher *)(local_1e8 + 0x10);
                                pVVar16 = toml::Value::find((Value *)p_Var15,(string *)local_1e8);
                                if ((SamplePublisher *)local_1e8._0_8_ !=
                                    (SamplePublisher *)(local_1e8 + 0x10)) {
                                  operator_delete((void *)local_1e8._0_8_,
                                                  CONCAT17(local_1d8[0]._M_local_buf[7],
                                                           CONCAT25(local_1d8[0].
                                                                    _M_allocated_capacity._5_2_,
                                                                    CONCAT14(local_1d8[0].
                                                                             _M_local_buf[4],
                                                                             (undefined4)
                                                                             local_1d8[0].
                                                                             _M_allocated_capacity))
                                                          ) + 1);
                                }
                                _Var8._M_p = local_238._M_dataplus._M_p;
                                if (pVVar16 != (Value *)0x0) {
                                  iVar11 = toml::Value::ValueConverter<int>::to
                                                     ((ValueConverter<int> *)local_1e8,pVVar16);
                                  Publisher::setSendBuffer((Publisher *)_Var8._M_p,iVar11);
                                }
                                _Var8._M_p = local_238._M_dataplus._M_p;
                                local_238._M_dataplus._M_p = (pointer)0x0;
                                _Var6._M_head_impl =
                                     (__return_storage_ptr__->decoder).packetPublisher._M_t.
                                     super___uniq_ptr_impl<PacketPublisher,_std::default_delete<PacketPublisher>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_PacketPublisher_*,_std::default_delete<PacketPublisher>_>
                                     .super__Head_base<0UL,_PacketPublisher_*,_false>._M_head_impl;
                                (__return_storage_ptr__->decoder).packetPublisher._M_t.
                                super___uniq_ptr_impl<PacketPublisher,_std::default_delete<PacketPublisher>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_PacketPublisher_*,_std::default_delete<PacketPublisher>_>
                                .super__Head_base<0UL,_PacketPublisher_*,_false>._M_head_impl =
                                     (PacketPublisher *)_Var8._M_p;
                                if (_Var6._M_head_impl != (PacketPublisher *)0x0) {
                                  (**(code **)(*(long *)&(_Var6._M_head_impl)->super_Publisher + 8))
                                            ();
                                }
                                if ((pointer)local_238._M_dataplus._M_p != (pointer)0x0) {
                                  (**(code **)(*(long *)local_238._M_dataplus._M_p + 8))();
                                }
                              }
                              else {
                                iVar11 = std::__cxx11::string::compare((char *)key_00);
                                if (iVar11 != 0) goto LAB_001330f8;
                                anon_unknown.dwarf_1996e::createStatsPublisher
                                          ((StatsPublisher *)local_1e8,(Value *)p_Var15);
                                local_238._M_dataplus._M_p =
                                     (pointer)(__return_storage_ptr__->decoder).statsPublisher.bind.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start;
                                local_238._M_string_length =
                                     (size_type)
                                     (__return_storage_ptr__->decoder).statsPublisher.bind.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish;
                                local_238.field_2._M_allocated_capacity =
                                     (size_type)
                                     (__return_storage_ptr__->decoder).statsPublisher.bind.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                (__return_storage_ptr__->decoder).statsPublisher.bind.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1e8._0_8_
                                ;
                                (__return_storage_ptr__->decoder).statsPublisher.bind.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish =
                                     (pointer)local_1e8._8_8_;
                                (__return_storage_ptr__->decoder).statsPublisher.bind.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                     (pointer)CONCAT17(local_1d8[0]._M_local_buf[7],
                                                       CONCAT25(local_1d8[0]._M_allocated_capacity.
                                                                _5_2_,CONCAT14(local_1d8[0].
                                                                               _M_local_buf[4],
                                                                               (undefined4)
                                                                               local_1d8[0].
                                                                               _M_allocated_capacity
                                                                              )));
                                local_1e8._0_8_ = (SamplePublisher *)0x0;
                                local_1e8._8_8_ = (pointer)0x0;
                                local_1d8[0]._M_allocated_capacity._0_4_ = 0;
                                local_1d8[0]._M_local_buf[4] = '\0';
                                local_1d8[0]._M_allocated_capacity._5_2_ = 0;
                                local_1d8[0]._7_4_ = local_1d8[0]._7_4_ & 0xffffff00;
                                std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)&local_238);
                                (__return_storage_ptr__->decoder).statsPublisher.sendBuffer =
                                     CONCAT44(local_1d8[0]._12_4_,
                                              CONCAT13(local_1d8[0]._M_local_buf[0xb],
                                                       local_1d8[0]._8_3_));
                                std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)local_1e8);
                              }
                              p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17);
                            } while (p_Var17 != local_218);
                          }
                        }
                        else {
                          iVar11 = std::__cxx11::string::compare((char *)key_00);
                          if (iVar11 != 0) {
LAB_001330f8:
                            anon_unknown.dwarf_1996e::throwInvalidKey((string *)key_00);
LAB_00133100:
                            piVar18 = (invalid_argument *)__cxa_allocate_exception(0x10);
                            std::invalid_argument::invalid_argument
                                      (piVar18,"Expected \'max_deviation\' to be positive");
LAB_0013313a:
                            __cxa_throw(piVar18,&std::invalid_argument::typeinfo,
                                        std::invalid_argument::~invalid_argument);
                          }
                          anon_unknown.dwarf_1996e::loadMonitor(local_210,(Value *)v);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      p_Var17 = (_Base_ptr)std::_Rb_tree_increment(local_1f0);
    } while (p_Var17 != local_200);
  }
  pcVar2 = local_1e8 + 0x10;
  local_1e8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e8,"inproc://demodulator_stats","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(__return_storage_ptr__->demodulator).statsPublisher,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8);
  if ((pointer)local_1e8._0_8_ != pcVar2) {
    operator_delete((void *)local_1e8._0_8_,
                    CONCAT17(local_1d8[0]._M_local_buf[7],
                             CONCAT25(local_1d8[0]._M_allocated_capacity._5_2_,
                                      CONCAT14(local_1d8[0]._M_local_buf[4],
                                               (undefined4)local_1d8[0]._M_allocated_capacity))) + 1
                   );
  }
  local_1e8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"inproc://decoder_stats","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(__return_storage_ptr__->decoder).statsPublisher,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8);
  if ((pointer)local_1e8._0_8_ != pcVar2) {
    operator_delete((void *)local_1e8._0_8_,
                    CONCAT17(local_1d8[0]._M_local_buf[7],
                             CONCAT25(local_1d8[0]._M_allocated_capacity._5_2_,
                                      CONCAT14(local_1d8[0]._M_local_buf[4],
                                               (undefined4)local_1d8[0]._M_allocated_capacity))) + 1
                   );
  }
  iVar11 = std::__cxx11::string::compare((char *)__return_storage_ptr__);
  if (iVar11 == 0) {
    if ((__return_storage_ptr__->airspy).frequency == 0) {
      (__return_storage_ptr__->airspy).frequency = 0x64ca9cc0;
    }
    if ((__return_storage_ptr__->rtlsdr).frequency == 0) {
      (__return_storage_ptr__->rtlsdr).frequency = 0x64ca9cc0;
    }
  }
  iVar11 = std::__cxx11::string::compare((char *)__return_storage_ptr__);
  if (iVar11 == 0) {
    if ((__return_storage_ptr__->airspy).frequency == 0) {
      (__return_storage_ptr__->airspy).frequency = 0x64f9ea20;
    }
    if ((__return_storage_ptr__->rtlsdr).frequency == 0) {
      (__return_storage_ptr__->rtlsdr).frequency = 0x64f9ea20;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_p != &local_40) {
    operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
  }
  toml::Value::~Value((Value *)local_60);
  return __return_storage_ptr__;
}

Assistant:

Config Config::load(const std::string& file) {
  Config out;

  auto pr = toml::parseFile(file);
  if (!pr.valid()) {
    throw std::invalid_argument(pr.errorReason);
  }

  const auto& table = pr.value.as<toml::Table>();
  for (const auto& it : table) {
    const auto& key = it.first;
    const auto& value = it.second;

    if (key == "demodulator") {
      loadDemodulator(out.demodulator, value);
      continue;
    }

    if (key == "airspy") {
      loadAirspySource(out.airspy, value);
      continue;
    }

    if (key == "rtlsdr") {
      loadRTLSDRSource(out.rtlsdr, value);
      continue;
    }

    if (key == "nanomsg") {
      loadNanomsgSource(out.nanomsg, value);
      continue;
    }

    if (key == "agc") {
      loadAGC(out.agc, value);
      continue;
    }

    if (key == "costas") {
      loadCostas(out.costas, value);
      continue;
    }

    if (key == "rrc") {
      loadRRC(out.rrc, value);
      continue;
    }

    if (key == "clock_recovery") {
      loadClockRecovery(out.clockRecovery, value);
      continue;
    }

    if (key == "quantization") {
      loadQuantization(out.quantization, value);
      continue;
    }

    if (key == "decoder") {
      loadDecoder(out.decoder, value);
      continue;
    }

    if (key == "monitor") {
      loadMonitor(out.monitor, value);
      continue;
    }

    throwInvalidKey(key);
  }

  const auto demodulatorStatsEndpoint = "inproc://demodulator_stats";
  const auto decoderStatsEndpoint = "inproc://decoder_stats";

  // Add inproc endpoints for the stats publishers
  out.demodulator.statsPublisher.bind.push_back(demodulatorStatsEndpoint);
  out.decoder.statsPublisher.bind.push_back(decoderStatsEndpoint);

  // If the mode field is used, we can populate sane defaults
  if (out.demodulator.downlinkType == "lrit") {
    setIfZero(out.airspy.frequency, 1691000000u);
    setIfZero(out.rtlsdr.frequency, 1691000000u);
  }
  if (out.demodulator.downlinkType == "hrit") {
    setIfZero(out.airspy.frequency, 1694100000u);
    setIfZero(out.rtlsdr.frequency, 1694100000u);
  }

  return out;
}